

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<void_(*)(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>::
cni_holder(cni_holder<void_(*)(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>
           *this,_func_void_any_ptr_any_ptr **func)

{
  function<void_(cs_impl::any_&,_cs_impl::any_&)> *in_RDI;
  cni_helper<void_(*)(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>
  *this_00;
  function<void_(cs_impl::any_&,_cs_impl::any_&)> *in_stack_ffffffffffffffc0;
  _func_void_any_ptr_any_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003b70c0;
  this_00 = (cni_helper<void_(*)(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<void(cs_impl::any&,cs_impl::any&)>::
  function<void(*const&)(cs_impl::any&,cs_impl::any&),void>(in_stack_ffffffffffffffc0,local_30);
  cni_helper<void_(*)(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>::
  cni_helper(this_00,in_RDI);
  std::function<void_(cs_impl::any_&,_cs_impl::any_&)>::~function
            ((function<void_(cs_impl::any_&,_cs_impl::any_&)> *)0x1ae806);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}